

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O3

void add_intrinsic_SAME1_ANYfi_SAME1(Context_conflict *ctx,char *fn)

{
  int iVar1;
  MOJOSHADER_astDataType *pMVar2;
  MOJOSHADER_astDataType *pMVar3;
  void *value;
  MOJOSHADER_astDataType *local_38;
  MOJOSHADER_astDataType *local_30;
  
  local_38 = &ctx->dt_uint;
  local_30 = local_38;
  pMVar2 = build_function_datatype(ctx,local_38,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint1",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint2",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint3",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint4",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint1x1",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint1x2",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint1x3",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint1x4",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint2x1",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint2x2",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint2x3",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint2x4",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint3x1",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint3x2",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint3x3",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint3x4",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint4x1",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint4x2",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint4x3",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint4x4",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  local_38 = &ctx->dt_int;
  local_30 = local_38;
  pMVar2 = build_function_datatype(ctx,local_38,2,&local_38,1);
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int1",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int2",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int3",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int4",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int1x1",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int1x2",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int1x3",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int1x4",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int2x1",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int2x2",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int2x3",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int2x4",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int3x1",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int3x2",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int3x3",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int3x4",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int4x1",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int4x2",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int4x3",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int4x4",&local_38);
  if (iVar1 != 0) {
    if (local_38 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (local_38->array).base;
    }
  }
  local_38 = pMVar3;
  local_30 = pMVar3;
  pMVar3 = build_function_datatype(ctx,pMVar3,2,&local_38,1);
  push_function(ctx,fn,pMVar3,0);
  add_intrinsic_SAME1_ANYf_SAME1(ctx,fn);
  return;
}

Assistant:

static void add_intrinsic_SAME1_ANYfi_SAME1(Context *ctx, const char *fn)
{
    ADD_INTRINSIC_ANY_INT(add_intrinsic2(ctx, fn, dt, dt, dt));
    add_intrinsic_SAME1_ANYf_SAME1(ctx, fn);
}